

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_symbol_codec.cpp
# Opt level: O2

void __thiscall crnlib::symbol_codec::arith_stop_encoding(symbol_codec *this)

{
  uint *puVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  bool bVar5;
  uchar local_19;
  
  if (this->m_arith_total_bits != 0) {
    bVar5 = 0x2000000 < this->m_arith_length;
    uVar4 = 0x8000;
    if (bVar5) {
      uVar4 = 0x800000;
    }
    uVar3 = (uint)bVar5 * 0x800000 + 0x800000;
    puVar1 = &this->m_arith_base;
    uVar2 = *puVar1;
    *puVar1 = *puVar1 + uVar3;
    this->m_arith_length = uVar4;
    if (CARRY4(uVar2,uVar3)) {
      arith_propagate_carry(this);
    }
    arith_renorm_enc_interval(this);
    while ((this->m_arith_output_buf).m_size < 4) {
      local_19 = '\0';
      vector<unsigned_char>::push_back(&this->m_arith_output_buf,&local_19);
      this->m_total_bits_written = this->m_total_bits_written + 8;
    }
  }
  return;
}

Assistant:

void symbol_codec::arith_stop_encoding()
    {
        if (!m_arith_total_bits)
        {
            return;
        }

        uint orig_base = m_arith_base;

        if (m_arith_length > 2 * cSymbolCodecArithMinLen)
        {
            m_arith_base += cSymbolCodecArithMinLen;
            m_arith_length = (cSymbolCodecArithMinLen >> 1);
        }
        else
        {
            m_arith_base += (cSymbolCodecArithMinLen >> 1);
            m_arith_length = (cSymbolCodecArithMinLen >> 9);
        }

        if (orig_base > m_arith_base)
        {
            arith_propagate_carry();
        }

        arith_renorm_enc_interval();

        while (m_arith_output_buf.size() < 4)
        {
            m_arith_output_buf.push_back(0);
            m_total_bits_written += 8;
        }
    }